

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O2

void __thiscall
tcu::TestSessionExecutor::leaveTestCase(TestSessionExecutor *this,TestCase *testCase)

{
  int *piVar1;
  bool bVar2;
  qpTestResult result;
  deUint64 dVar3;
  TestLog *pTVar4;
  TestContext *pTVar5;
  char *description;
  qpWatchDog *dog;
  deUint64 dVar6;
  char *pcVar7;
  string *unit;
  void *__buf;
  allocator<char> local_203;
  allocator<char> local_202;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  LogNumber<long> local_1a0 [3];
  
  (*((this->m_caseExecutor).
     super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.m_data.ptr)
    ->_vptr_TestCaseExecutor[3])();
  dVar6 = deGetMicroseconds();
  dVar3 = this->m_testStartTime;
  this->m_testStartTime = 0;
  pTVar4 = this->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"TestDuration",&local_201)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"Test case duration in microseconds",&local_202);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"us",&local_203);
  unit = &local_200;
  LogNumber<long>::LogNumber(local_1a0,&local_1c0,&local_1e0,unit,QP_KEY_TAG_TIME,dVar6 - dVar3);
  LogNumber<long>::write(local_1a0,(int)pTVar4,__buf,(size_t)unit);
  LogNumber<long>::~LogNumber(local_1a0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  pTVar5 = this->m_testCtx;
  result = pTVar5->m_testResult;
  description = (pTVar5->m_testResultDesc)._M_dataplus._M_p;
  bVar2 = pTVar5->m_terminateAfter;
  this->m_isInTestCase = false;
  TestLog::endCase(pTVar5->m_log,result,description);
  pcVar7 = qpGetTestResultName(result);
  tcu::print("  %s (%s)\n",pcVar7,description);
  (this->m_status).numExecuted = (this->m_status).numExecuted + 1;
  switch(result) {
  case QP_TEST_RESULT_PASS:
    piVar1 = &(this->m_status).numPassed;
    *piVar1 = *piVar1 + 1;
    break;
  default:
    piVar1 = &(this->m_status).numFailed;
    *piVar1 = *piVar1 + 1;
    break;
  case QP_TEST_RESULT_QUALITY_WARNING:
  case QP_TEST_RESULT_COMPATIBILITY_WARNING:
    piVar1 = &(this->m_status).numWarnings;
    *piVar1 = *piVar1 + 1;
    break;
  case QP_TEST_RESULT_NOT_SUPPORTED:
    piVar1 = &(this->m_status).numNotSupported;
    *piVar1 = *piVar1 + 1;
  }
  if ((result == QP_TEST_RESULT_RESOURCE_ERROR) || (bVar2 != false)) {
    this->m_abortSession = true;
  }
  dog = this->m_testCtx->m_watchDog;
  if (dog != (qpWatchDog *)0x0) {
    qpWatchDog_reset(dog);
  }
  return;
}

Assistant:

void TestSessionExecutor::leaveTestCase (TestCase* testCase)
{
	TestLog&	log		= m_testCtx.getLog();

	// De-init case.
	try
	{
		m_caseExecutor->deinit(testCase);
	}
	catch (const tcu::Exception& e)
	{
		log << e << TestLog::Message << "Error in test case deinit, test program will terminate." << TestLog::EndMessage;
		m_testCtx.setTerminateAfter(true);
	}

	{
		const deInt64 duration = deGetMicroseconds()-m_testStartTime;
		m_testStartTime = 0;
		m_testCtx.getLog() << TestLog::Integer("TestDuration", "Test case duration in microseconds", "us", QP_KEY_TAG_TIME, duration);
	}

	{
		const qpTestResult	testResult		= m_testCtx.getTestResult();
		const char* const	testResultDesc	= m_testCtx.getTestResultDesc();
		const bool			terminateAfter	= m_testCtx.getTerminateAfter();
		DE_ASSERT(testResult != QP_TEST_RESULT_LAST);

		m_isInTestCase = false;
		m_testCtx.getLog().endCase(testResult, testResultDesc);

		// Update statistics.
		print("  %s (%s)\n", qpGetTestResultName(testResult), testResultDesc);

		m_status.numExecuted += 1;
		switch (testResult)
		{
			case QP_TEST_RESULT_PASS:					m_status.numPassed			+= 1;	break;
			case QP_TEST_RESULT_NOT_SUPPORTED:			m_status.numNotSupported	+= 1;	break;
			case QP_TEST_RESULT_QUALITY_WARNING:		m_status.numWarnings		+= 1;	break;
			case QP_TEST_RESULT_COMPATIBILITY_WARNING:	m_status.numWarnings		+= 1;	break;
			default:									m_status.numFailed			+= 1;	break;
		}

		// terminateAfter, Resource error or any error in deinit means that execution should end
		if (terminateAfter || testResult == QP_TEST_RESULT_RESOURCE_ERROR)
			m_abortSession = true;
	}

	if (m_testCtx.getWatchDog())
		qpWatchDog_reset(m_testCtx.getWatchDog());
}